

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SudokuImage.cpp
# Opt level: O1

void convertInCoverMatrix
               (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *grid,vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                      *coverMatrix)

{
  pointer pvVar1;
  ulong *puVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong *__s;
  long lVar7;
  long lVar8;
  long lVar9;
  
  iVar3 = createCellConstraints(coverMatrix,0);
  iVar3 = createRowConstraints(coverMatrix,iVar3);
  iVar3 = createColumnConstraints(coverMatrix,iVar3);
  createBoxConstraints(coverMatrix,iVar3);
  lVar4 = 1;
  lVar7 = 0x18;
  do {
    lVar6 = 1;
    lVar8 = lVar7;
    do {
      uVar5 = (ulong)*(uint *)(*(long *)&(grid->
                                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start[lVar4 + -1].
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data + -4 + lVar6 * 4);
      if (uVar5 != 0) {
        lVar9 = 0;
        do {
          if (uVar5 * 0x28 + -0x28 != lVar9) {
            pvVar1 = (coverMatrix->
                     super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            __s = *(ulong **)((long)pvVar1 + lVar9 + -0x18 + lVar8);
            puVar2 = *(ulong **)((long)pvVar1 + lVar9 + -8 + lVar8);
            iVar3 = *(int *)((long)&(pvVar1->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                    super__Bvector_impl_data + lVar9 + lVar8);
            if (__s != puVar2) {
              memset(__s,0,(long)puVar2 - (long)__s);
              __s = puVar2;
            }
            if (iVar3 != 0) {
              *__s = *__s & ~(0xffffffffffffffffU >> (-(char)iVar3 & 0x3fU));
            }
          }
          lVar9 = lVar9 + 0x28;
        } while (lVar9 != 0x168);
      }
      lVar6 = lVar6 + 1;
      lVar8 = lVar8 + 0x168;
    } while (lVar6 != 10);
    lVar4 = lVar4 + 1;
    lVar7 = lVar7 + 0xca8;
  } while (lVar4 != 10);
  return;
}

Assistant:

void convertInCoverMatrix(vector<vector<int>> &grid, vector<vector<bool>> &coverMatrix){
    //createCoverMatrix(coverMatrix);
    
    int header = 0;
    header = createCellConstraints(coverMatrix, header);
    header = createRowConstraints(coverMatrix, header);
    header = createColumnConstraints(coverMatrix, header);
    createBoxConstraints(coverMatrix, header);

    // Taking into account the values already entered in Sudoku's grid instance
    for (int row = COVER_START_INDEX; row <= SIZE; row++) {
      for (int column = COVER_START_INDEX; column <= SIZE; column++) {
        int n = grid[row - 1][column - 1];
        if (n != EMPTY_CELL) {
          for (int num = MIN_VALUE; num <= MAX_VALUE; num++) {
            if (num != n) {
                std::fill(coverMatrix[indexInCoverMatrix(row, column, num)].begin(), coverMatrix[indexInCoverMatrix(row, column, num)].end(), false);
            }
          }
        }
      }
    }
}